

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void nullcPrintFunctionPointerInfo(ExternTypeInfo *type,char *ptr,uint indentDepth)

{
  ExternTypeInfo *pEVar1;
  ExternFuncInfo *pEVar2;
  ExternMemberInfo *pEVar3;
  ExternLocalInfo *pEVar4;
  uint uVar5;
  char *pcVar6;
  char *local_70;
  ExternLocalInfo *lInfo;
  uint arg;
  ExternTypeInfo *returnType;
  ExternFuncInfo *func;
  ExternLocalInfo *codeLocals;
  ExternMemberInfo *codeTypeExtra;
  ExternFuncInfo *codeFunctions;
  ExternTypeInfo *codeTypes;
  char *codeSymbols;
  uint indentDepth_local;
  char *ptr_local;
  ExternTypeInfo *type_local;
  
  local_70 = nullcDebugSymbols((uint *)0x0);
  pEVar1 = nullcDebugTypeInfo((uint *)0x0);
  pEVar2 = nullcDebugFunctionInfo((uint *)0x0);
  pEVar3 = nullcDebugTypeExtraInfo((uint *)0x0);
  pEVar4 = nullcDebugLocalInfo((uint *)0x0);
  pEVar2 = pEVar2 + *(int *)(ptr + 8);
  uVar5 = pEVar3[(type->field_11).subType].type;
  nullcPrintDepthIndent(indentDepth);
  printf("function %d %s %s(",(ulong)*(uint *)(ptr + 8),local_70 + pEVar1[uVar5].offsetToName,
         local_70 + pEVar2->offsetToName);
  for (lInfo._4_4_ = 0; lInfo._4_4_ < pEVar2->paramCount; lInfo._4_4_ = lInfo._4_4_ + 1) {
    uVar5 = pEVar2->offsetToFirstLocal + lInfo._4_4_;
    pcVar6 = ", ";
    if (lInfo._4_4_ == pEVar2->paramCount - 1) {
      pcVar6 = "";
    }
    printf("%s %s%s",local_70 + pEVar1[pEVar4[uVar5].type].offsetToName,
           local_70 + pEVar4[uVar5].offsetToName,pcVar6);
  }
  printf(")\n");
  nullcPrintDepthIndent(indentDepth);
  if (pEVar2->contextType == 0xffffffff) {
    local_70 = "void ref";
  }
  else {
    local_70 = local_70 + pEVar1[pEVar2->contextType].offsetToName;
  }
  printf("%s context = %p\n",local_70,*(undefined8 *)ptr);
  if (*(long *)ptr != 0) {
    nullcPrintVariableInfo
              (pEVar1 + pEVar1[pEVar2->contextType].field_11.subType,*(char **)ptr,indentDepth + 1);
  }
  return;
}

Assistant:

void nullcPrintFunctionPointerInfo(const ExternTypeInfo& type, char* ptr, unsigned indentDepth)
{
	char *codeSymbols = nullcDebugSymbols(NULL);
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(NULL);
	ExternFuncInfo *codeFunctions = nullcDebugFunctionInfo(NULL);
	ExternMemberInfo *codeTypeExtra = nullcDebugTypeExtraInfo(NULL);
	ExternLocalInfo *codeLocals = nullcDebugLocalInfo(NULL);

	ExternFuncInfo &func = codeFunctions[*(int*)(ptr + NULLC_PTR_SIZE)];
	ExternTypeInfo &returnType = codeTypes[codeTypeExtra[type.memberOffset].type];

	nullcPrintDepthIndent(indentDepth);
	printf("function %d %s %s(", *(int*)(ptr + NULLC_PTR_SIZE), codeSymbols + returnType.offsetToName, codeSymbols + func.offsetToName);
	for(unsigned arg = 0; arg < func.paramCount; arg++)
	{
		ExternLocalInfo &lInfo = codeLocals[func.offsetToFirstLocal + arg];
		printf("%s %s%s", codeSymbols + codeTypes[lInfo.type].offsetToName, codeSymbols + lInfo.offsetToName, arg == func.paramCount - 1 ? "" : ", ");
	}
	printf(")\n");

	nullcPrintDepthIndent(indentDepth);
	printf("%s context = %p\n", func.contextType == ~0u ? "void ref" : codeSymbols + codeTypes[func.contextType].offsetToName, *(void**)(ptr));

	if(*(char**)(ptr))
		nullcPrintVariableInfo(codeTypes[codeTypes[func.contextType].subType], *(char**)(ptr), indentDepth + 1);
}